

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O2

ChQuaternion<double> *
chrono::Q_from_AngX(ChQuaternion<double> *__return_storage_ptr__,double angleX)

{
  Q_from_AngAxis(__return_storage_ptr__,angleX,(ChVector<double> *)&VECT_X);
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Q_from_AngX(double angleX) {
    return Q_from_AngAxis(angleX, VECT_X);
}